

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

ptls_t * new_instance(ptls_context_t *ctx,int is_server)

{
  st_ptls_update_open_count_t *psVar1;
  ptls_t *ppVar2;
  
  if (ctx->get_time != (ptls_get_time_t *)0x0) {
    ppVar2 = (ptls_t *)malloc(0x200);
    if (ppVar2 != (ptls_t *)0x0) {
      psVar1 = ctx->update_open_count;
      if (psVar1 != (st_ptls_update_open_count_t *)0x0) {
        (*psVar1->cb)(psVar1,1);
      }
      memset(&ppVar2->state,0,0x1f8);
      ppVar2->ctx = ctx;
      ppVar2->field_0x160 = ctx->field_0x70 & 4 | ppVar2->field_0x160 & 0xda | (byte)is_server & 1;
    }
    return ppVar2;
  }
  __assert_fail("ctx->get_time != NULL && \"please set ctx->get_time to `&ptls_get_time`; see #92\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                ,0x10ea,"ptls_t *new_instance(ptls_context_t *, int)");
}

Assistant:

static ptls_t *new_instance(ptls_context_t *ctx, int is_server)
{
    ptls_t *tls;

    assert(ctx->get_time != NULL && "please set ctx->get_time to `&ptls_get_time`; see #92");

    if ((tls = malloc(sizeof(*tls))) == NULL)
        return NULL;

    update_open_count(ctx, 1);
    *tls = (ptls_t){ctx};
    tls->is_server = is_server;
    tls->send_change_cipher_spec = ctx->send_change_cipher_spec;
    tls->skip_tracing = ptls_default_skip_tracing;
    return tls;
}